

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O2

void outputUString(UChar *s,int32_t len,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  UChar UVar1;
  long lVar2;
  
  if (s == (UChar *)0x0) {
    outputString((char *)0x0,outBuf,outIx,capacity,indent);
    return;
  }
  lVar2 = 0;
  do {
    if (len != -1 && len <= lVar2) {
      return;
    }
    UVar1 = s[lVar2];
    outputHexBytes((ulong)(ushort)UVar1,4,outBuf,outIx,capacity);
    outputChar(' ',outBuf,outIx,capacity,indent);
    lVar2 = lVar2 + 1;
  } while ((len != -1) || (UVar1 != L'\0'));
  return;
}

Assistant:

static void outputUString(const UChar *s, int32_t len, 
                          char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i = 0;
    UChar   c;
    if (s==NULL) {
        outputString(NULL, outBuf, outIx, capacity, indent);
        return;
    }

    for (i=0; i<len || len==-1; i++) {
        c = s[i];
        outputHexBytes(c, 4, outBuf, outIx, capacity);
        outputChar(' ', outBuf, outIx, capacity, indent);
        if (len == -1 && c==0) {
            break;
        }
    }
}